

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

void __thiscall Sym::Sym(Sym *this,string *type,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  string local_78;
  string local_58;
  string *local_28;
  string *value_local;
  string *name_local;
  string *type_local;
  Sym *this_local;
  
  local_28 = value;
  value_local = name;
  name_local = type;
  type_local = &this->Name;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->Type);
  this->iValue = 0;
  this->dValue = 0.0;
  std::__cxx11::string::operator=((string *)this,(string *)name);
  std::__cxx11::string::operator=((string *)&this->Type,(string *)type);
  bVar1 = std::operator==(type,"real");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,(string *)value);
    dVar3 = str2double(this,&local_58);
    this->dValue = dVar3;
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,(string *)value);
    iVar2 = str2int(this,&local_78);
    this->iValue = iVar2;
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

Sym::Sym(std::string type, std::string name, std::string value) {
    Name = name;
    Type = type;
    if (type == "real") {
        dValue = str2double(value);
    } else {//int
        iValue = str2int(value);
    }
}